

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::PrevTransition
          (TimeZoneInfo *this,time_point<seconds> *tp,civil_transition *trans)

{
  undefined1 uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined8 uVar2;
  detail *this_00;
  undefined3 uVar7;
  int_least8_t iVar8;
  int_least8_t iVar9;
  int_least8_t iVar10;
  int_least8_t iVar11;
  undefined3 uVar12;
  Transition *pTVar13;
  bool bVar14;
  const_reference pvVar15;
  size_type sVar16;
  Transition *pTVar17;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> cVar18;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> a;
  uint_fast8_t local_e1;
  int_least64_t local_b8;
  undefined8 local_b0;
  uint_fast8_t prev_type_index;
  Transition *pTStack_a0;
  Transition *tr;
  Transition target;
  int_least64_t local_58;
  undefined8 local_50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  local_48;
  Transition *local_40;
  int_fast64_t unix_time;
  Transition *end;
  Transition *begin;
  civil_transition *trans_local;
  time_point<seconds> *tp_local;
  TimeZoneInfo *this_local;
  
  begin = (Transition *)trans;
  trans_local = (civil_transition *)tp;
  tp_local = (time_point<seconds> *)this;
  bVar14 = std::
           vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ::empty(&this->transitions_);
  if (bVar14) {
    this_local._7_1_ = false;
  }
  else {
    pvVar15 = std::
              vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
              ::operator[](&this->transitions_,0);
    end = pvVar15;
    sVar16 = std::
             vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
             ::size(&this->transitions_);
    unix_time = (int_fast64_t)(pvVar15 + sVar16);
    if (end->unix_time < -0x7ffffffffffffff) {
      end = end + 1;
    }
    local_40 = (Transition *)ToUnixSeconds((time_point<seconds> *)trans_local);
    local_48.__d.__r = (duration)FromUnixSeconds((int_fast64_t)local_40);
    bVar14 = std::chrono::operator!=
                       (&local_48,
                        (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                         *)trans_local);
    pTVar13 = local_40;
    if (bVar14) {
      pTVar17 = (Transition *)std::numeric_limits<long>::max();
      if (pTVar13 == pTVar17) {
        if ((Transition *)unix_time == end) {
          return false;
        }
        target.prev_civil_sec.f_._8_8_ = *(undefined8 *)(unix_time + -0x10);
        cVar18.f_.m = '\x01';
        cVar18.f_.d = '\0';
        cVar18.f_.hh = '\0';
        cVar18.f_.mm = '\0';
        cVar18.f_.ss = '\0';
        cVar18.f_._13_3_ = 0;
        cVar18.f_.y = *(int_least64_t *)(unix_time + -8);
        unix_time = unix_time + -0x30;
        cVar18 = detail::operator+((detail *)target.prev_civil_sec.f_._8_8_,cVar18,
                                   target.prev_civil_sec.f_._8_8_);
        local_58 = cVar18.f_.y;
        begin->unix_time = local_58;
        local_50 = cVar18.f_._8_8_;
        *(undefined8 *)&begin->type_index = local_50;
        (begin->civil_sec).f_.y = *(int_least64_t *)(unix_time + 0x10);
        uVar2 = *(undefined8 *)(unix_time + 0x18);
        (begin->civil_sec).f_.m = (char)uVar2;
        (begin->civil_sec).f_.d = (char)((ulong)uVar2 >> 8);
        (begin->civil_sec).f_.hh = (char)((ulong)uVar2 >> 0x10);
        (begin->civil_sec).f_.mm = (char)((ulong)uVar2 >> 0x18);
        (begin->civil_sec).f_.ss = (char)((ulong)uVar2 >> 0x20);
        *(int3 *)&(begin->civil_sec).f_.field_0xd = (int3)((ulong)uVar2 >> 0x28);
        return true;
      }
      local_40 = (Transition *)((long)&local_40->unix_time + 1);
    }
    tr = local_40;
    target.unix_time._0_1_ = 0;
    detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::civil_time
              ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
               &target.type_index);
    detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::civil_time
              ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
               &target.civil_sec.f_.m);
    for (pTStack_a0 = std::
                      lower_bound<absl::lts_20250127::time_internal::cctz::Transition_const*,absl::lts_20250127::time_internal::cctz::Transition,absl::lts_20250127::time_internal::cctz::Transition::ByUnixTime>
                                (end,unix_time,&tr); pTStack_a0 != end; pTStack_a0 = pTStack_a0 + -1
        ) {
      if (pTStack_a0 + -1 == end) {
        local_e1 = this->default_transition_type_;
      }
      else {
        local_e1 = pTStack_a0[-2].type_index;
      }
      bVar14 = EquivTransitions(this,local_e1,pTStack_a0[-1].type_index);
      if (!bVar14) break;
    }
    if (pTStack_a0 == end) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = (detail *)pTStack_a0[-1].prev_civil_sec.f_.y;
      uVar1 = pTStack_a0[-1].prev_civil_sec.f_.m;
      uVar3 = pTStack_a0[-1].prev_civil_sec.f_.d;
      uVar4 = pTStack_a0[-1].prev_civil_sec.f_.hh;
      uVar5 = pTStack_a0[-1].prev_civil_sec.f_.mm;
      uVar6 = pTStack_a0[-1].prev_civil_sec.f_.ss;
      uVar7 = *(undefined3 *)&pTStack_a0[-1].prev_civil_sec.f_.field_0xd;
      a.f_.y._5_3_ = uVar7;
      a.f_.y._4_1_ = uVar6;
      a.f_.y._3_1_ = uVar5;
      a.f_.y._2_1_ = uVar4;
      a.f_.y._1_1_ = uVar3;
      a.f_.y._0_1_ = uVar1;
      a.f_.m = '\x01';
      a.f_.d = '\0';
      a.f_.hh = '\0';
      a.f_.mm = '\0';
      a.f_.ss = '\0';
      a.f_._13_3_ = 0;
      cVar18 = detail::operator+(this_00,a,(diff_t)this_00);
      local_b8 = cVar18.f_.y;
      begin->unix_time = local_b8;
      local_b0 = cVar18.f_._8_8_;
      *(undefined8 *)&begin->type_index = local_b0;
      (begin->civil_sec).f_.y = pTStack_a0[-1].civil_sec.f_.y;
      iVar8 = pTStack_a0[-1].civil_sec.f_.d;
      iVar9 = pTStack_a0[-1].civil_sec.f_.hh;
      iVar10 = pTStack_a0[-1].civil_sec.f_.mm;
      iVar11 = pTStack_a0[-1].civil_sec.f_.ss;
      uVar12 = *(undefined3 *)&pTStack_a0[-1].civil_sec.f_.field_0xd;
      (begin->civil_sec).f_.m = pTStack_a0[-1].civil_sec.f_.m;
      (begin->civil_sec).f_.d = iVar8;
      (begin->civil_sec).f_.hh = iVar9;
      (begin->civil_sec).f_.mm = iVar10;
      (begin->civil_sec).f_.ss = iVar11;
      *(undefined3 *)&(begin->civil_sec).f_.field_0xd = uVar12;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TimeZoneInfo::PrevTransition(const time_point<seconds>& tp,
                                  time_zone::civil_transition* trans) const {
  if (transitions_.empty()) return false;
  const Transition* begin = &transitions_[0];
  const Transition* end = begin + transitions_.size();
  if (begin->unix_time <= -(1LL << 59)) {
    // Do not report the BIG_BANG found in some zoneinfo data as it is
    // really a sentinel, not a transition.  See pre-2018f tz/zic.c.
    ++begin;
  }
  std::int_fast64_t unix_time = ToUnixSeconds(tp);
  if (FromUnixSeconds(unix_time) != tp) {
    if (unix_time == std::numeric_limits<std::int_fast64_t>::max()) {
      if (end == begin) return false;  // Ignore future_spec_.
      trans->from = (--end)->prev_civil_sec + 1;
      trans->to = end->civil_sec;
      return true;
    }
    unix_time += 1;  // ceils
  }
  const Transition target = {unix_time, 0, civil_second(), civil_second()};
  const Transition* tr =
      std::lower_bound(begin, end, target, Transition::ByUnixTime());
  for (; tr != begin; --tr) {  // skip no-op transitions
    std::uint_fast8_t prev_type_index =
        (tr - 1 == begin) ? default_transition_type_ : tr[-2].type_index;
    if (!EquivTransitions(prev_type_index, tr[-1].type_index)) break;
  }
  // When tr == end we return the "last" transition, ignoring future_spec_.
  if (tr == begin) return false;
  trans->from = (--tr)->prev_civil_sec + 1;
  trans->to = tr->civil_sec;
  return true;
}